

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_soundclass_S_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  bool bVar1;
  FString local_38;
  FString tmp;
  char *str;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  APlayerPawn *defaults_local;
  
  tmp.Chars = params[1].s;
  FString::FString(&local_38,tmp.Chars);
  FString::ReplaceChars(&local_38,' ','_');
  bVar1 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0x9c4,
                  "void Handler_soundclass_S_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  FString::operator=((FString *)
                     ((long)&info[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType
                             .super_PCompoundType.super_PType.super_PTypeBase + 8),&local_38);
  FString::~FString(&local_38);
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, soundclass, S, PlayerPawn)
{
	PROP_STRING_PARM(str, 0);

	FString tmp = str;
	tmp.ReplaceChars (' ', '_');
	assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	static_cast<PClassPlayerPawn *>(info)->SoundClass = tmp;
}